

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TOIFactoredRewardDecPOMDPDiscrete.cpp
# Opt level: O1

void __thiscall
TOIFactoredRewardDecPOMDPDiscrete::TOIFactoredRewardDecPOMDPDiscrete
          (TOIFactoredRewardDecPOMDPDiscrete *this,string *name,string *descr,string *pf,
          bool cacheFlatModels)

{
  *(undefined8 *)&this->field_0x2d8 = 0x5d7458;
  *(undefined8 *)&this->field_0x2e0 = 0x5d76b0;
  TOIDecPOMDPDiscrete::TOIDecPOMDPDiscrete
            (&this->super_TOIDecPOMDPDiscrete,&PTR_construction_vtable_96__005d61f0,name,descr,pf,
             cacheFlatModels);
  *(undefined8 *)
   &(this->super_TOIDecPOMDPDiscrete).super_TransitionObservationIndependentMADPDiscrete.
    super_MultiAgentDecisionProcess = 0x5d5a38;
  *(undefined8 *)&this->field_0x2d8 = 0x5d5e18;
  *(undefined8 *)&this->field_0x2e0 = 0x5d6070;
  *(undefined8 *)
   &(this->super_TOIDecPOMDPDiscrete).super_TransitionObservationIndependentMADPDiscrete.field_0x280
       = 0x5d5c90;
  *(undefined8 *)&(this->super_TOIDecPOMDPDiscrete).field_0x2c0 = 0;
  *(undefined8 *)&this->field_0x2c8 = 0;
  *(undefined8 *)&this->field_0x2d0 = 0;
  (this->super_TOIDecPOMDPDiscrete).field_0x2b8 = 0;
  return;
}

Assistant:

TOIFactoredRewardDecPOMDPDiscrete::
TOIFactoredRewardDecPOMDPDiscrete(
    const string &name, const string &descr, const string &pf,
    bool cacheFlatModels) :
    TOIDecPOMDPDiscrete(name, descr, pf, cacheFlatModels)
{
    _m_initialized = false;
}